

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

void __thiscall ReconnectingHub::stepAndReconnect(ReconnectingHub *this)

{
  Dashel::Hub::step((int)this);
  if (this->connected != false) {
    return;
  }
  connectToTarget(this);
  return;
}

Assistant:

void stepAndReconnect()
	{
		// first step
		step(1000);
		// if disconnected...
		if (!connected)
		{
			// ...attempt to reconnect
			connectToTarget();
		}
	}